

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlHaltParser(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    ctxt->instate = XML_PARSER_EOF;
    ctxt->disableSAX = 1;
    while (1 < ctxt->inputNr) {
      pxVar1 = inputPop(ctxt);
      xmlFreeInputStream(pxVar1);
    }
    pxVar1 = ctxt->input;
    if (pxVar1 != (xmlParserInputPtr)0x0) {
      if (pxVar1->free != (xmlParserInputDeallocate)0x0) {
        (*pxVar1->free)(pxVar1->base);
        pxVar1 = ctxt->input;
        pxVar1->free = (xmlParserInputDeallocate)0x0;
      }
      if (pxVar1->buf != (xmlParserInputBufferPtr)0x0) {
        xmlFreeParserInputBuffer(pxVar1->buf);
        pxVar1 = ctxt->input;
        pxVar1->buf = (xmlParserInputBufferPtr)0x0;
      }
      pxVar1->cur = "";
      pxVar1->length = 0;
      pxVar1->base = "";
      pxVar1->end = "";
    }
  }
  return;
}

Assistant:

static void
xmlHaltParser(xmlParserCtxtPtr ctxt) {
    if (ctxt == NULL)
        return;
    ctxt->instate = XML_PARSER_EOF;
    ctxt->disableSAX = 1;
    while (ctxt->inputNr > 1)
        xmlFreeInputStream(inputPop(ctxt));
    if (ctxt->input != NULL) {
        /*
	 * in case there was a specific allocation deallocate before
	 * overriding base
	 */
        if (ctxt->input->free != NULL) {
	    ctxt->input->free((xmlChar *) ctxt->input->base);
	    ctxt->input->free = NULL;
	}
        if (ctxt->input->buf != NULL) {
            xmlFreeParserInputBuffer(ctxt->input->buf);
            ctxt->input->buf = NULL;
        }
	ctxt->input->cur = BAD_CAST"";
        ctxt->input->length = 0;
	ctxt->input->base = ctxt->input->cur;
        ctxt->input->end = ctxt->input->cur;
    }
}